

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::SourceBreakpoint>::construct
          (BasicTypeInfo<dap::SourceBreakpoint> *this,void *ptr)

{
  memset(ptr,0,0x90);
  *(long *)((long)ptr + 0x10) = (long)ptr + 0x20;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined1 *)((long)ptr + 0x30) = 0;
  *(long *)((long)ptr + 0x38) = (long)ptr + 0x48;
  *(undefined8 *)((long)ptr + 0x40) = 0;
  *(undefined1 *)((long)ptr + 0x48) = 0;
  *(undefined1 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(long *)((long)ptr + 0x68) = (long)ptr + 0x78;
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined1 *)((long)ptr + 0x78) = 0;
  *(undefined1 *)((long)ptr + 0x88) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }